

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O2

void helper_gvec_fcmlas_idx_arm(void *vd,void *vn,void *vm,void *vfpst,uint32_t desc)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  float32 fVar6;
  float32 fVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  
  uVar1 = (desc & 0x1f) * 8 + 8;
  uVar9 = (ulong)uVar1;
  uVar10 = desc >> 10 & 1;
  uVar11 = desc >> 0xb;
  uVar12 = 0;
  while (uVar12 < uVar1 >> 2) {
    lVar8 = (uVar11 & 6) + uVar12;
    uVar3 = *(uint *)((long)vm + lVar8 * 4);
    uVar4 = *(uint *)((long)vm + lVar8 * 4 + 4);
    uVar5 = uVar4;
    if (uVar10 != 0) {
      uVar5 = uVar3;
      uVar3 = uVar4;
    }
    uVar2 = uVar12 + 4;
    for (uVar13 = uVar12; uVar12 = uVar2, uVar13 < uVar2; uVar13 = uVar13 + 2) {
      fVar7 = *(float32 *)((long)vn + uVar13 * 4 + (ulong)uVar10 * 4);
      fVar6 = float32_muladd_arm(fVar7,uVar3 ^ (desc >> 10 ^ uVar11) << 0x1f,
                                 *(float32 *)((long)vd + uVar13 * 4),0,(float_status *)vfpst);
      *(float32 *)((long)vd + uVar13 * 4) = fVar6;
      fVar7 = float32_muladd_arm(fVar7,uVar5 ^ uVar11 << 0x1f,
                                 *(float32 *)((long)vd + uVar13 * 4 + 4),0,(float_status *)vfpst);
      *(float32 *)((long)vd + uVar13 * 4 + 4) = fVar7;
    }
  }
  for (; uVar9 < (desc >> 2 & 0xf8) + 8; uVar9 = uVar9 + 8) {
    *(undefined8 *)((long)vd + uVar9) = 0;
  }
  return;
}

Assistant:

void HELPER(gvec_fcmlas_idx)(void *vd, void *vn, void *vm,
                             void *vfpst, uint32_t desc)
{
    uintptr_t opr_sz = simd_oprsz(desc);
    float32 *d = vd;
    float32 *n = vn;
    float32 *m = vm;
    float_status *fpst = vfpst;
    intptr_t flip = extract32(desc, SIMD_DATA_SHIFT, 1);
    uint32_t neg_imag = extract32(desc, SIMD_DATA_SHIFT + 1, 1);
    intptr_t index = extract32(desc, SIMD_DATA_SHIFT + 2, 2);
    uint32_t neg_real = flip ^ neg_imag;
    intptr_t elements = opr_sz / sizeof(float32);
    intptr_t eltspersegment = 16 / sizeof(float32);
    intptr_t i, j;

    /* Shift boolean to the sign bit so we can xor to negate.  */
    neg_real <<= 31;
    neg_imag <<= 31;

    for (i = 0; i < elements; i += eltspersegment) {
        float32 mr = m[H4(i + 2 * index + 0)];
        float32 mi = m[H4(i + 2 * index + 1)];
        float32 e1 = neg_real ^ (flip ? mi : mr);
        float32 e3 = neg_imag ^ (flip ? mr : mi);

        for (j = i; j < i + eltspersegment; j += 2) {
            float32 e2 = n[H4(j + flip)];
            float32 e4 = e2;

            d[H4(j)] = float32_muladd(e2, e1, d[H4(j)], 0, fpst);
            d[H4(j + 1)] = float32_muladd(e4, e3, d[H4(j + 1)], 0, fpst);
        }
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}